

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

SimpleHashedEntry<unsigned_int,_InductionVariable> * __thiscall
Memory::
AllocateArray<Memory::JitArenaAllocator,JsUtil::SimpleHashedEntry<unsigned_int,InductionVariable>,false>
          (Memory *this,JitArenaAllocator *allocator,offset_in_JitArenaAllocator_to_subr AllocFunc,
          size_t count)

{
  SimpleHashedEntry<unsigned_int,_InductionVariable> *pSVar1;
  ulong uVar2;
  
  if (count == 0) {
    pSVar1 = (SimpleHashedEntry<unsigned_int,_InductionVariable> *)0x8;
  }
  else {
    uVar2 = 0;
    pSVar1 = (SimpleHashedEntry<unsigned_int,_InductionVariable> *)
             new__<Memory::JitArenaAllocator>
                       (-(ulong)(count >> 0x3b != 0) | count << 5,(JitArenaAllocator *)this,
                        (offset_in_JitArenaAllocator_to_subr)allocator);
    do {
      InductionVariable::InductionVariable
                ((InductionVariable *)
                 ((long)&(pSVar1->
                         super_DefaultHashedEntry<unsigned_int,_InductionVariable,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                         ).super_ImplicitKeyValueEntry<unsigned_int,_InductionVariable>.
                         super_ValueEntry<InductionVariable,_JsUtil::(anonymous_namespace)::ValueEntryData<InductionVariable>_>
                         .super_ValueEntryData<InductionVariable>.value.sym + uVar2));
      uVar2 = uVar2 + 0x20;
    } while (count << 5 != uVar2);
  }
  return pSVar1;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}